

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign.hpp
# Opt level: O0

void remora::kernels::detail::
     matrix_assign<remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::row_major,remora::dense_tag,remora::dense_tag,remora::cpu_tag>
               (undefined8 param_1,undefined8 param_2)

{
  type transE;
  type transM;
  undefined1 local_58 [24];
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffffc0;
  undefined1 local_38 [32];
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = param_2;
  local_10 = param_1;
  trans<remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::cpu_tag>
            ((matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
              *)in_stack_ffffffffffffffc0);
  trans<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::cpu_tag>
            (in_stack_ffffffffffffffc0);
  matrix_assign<remora::dense_matrix_adaptor<double,remora::row_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double_const,remora::column_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::column_major,remora::dense_tag,remora::dense_tag,remora::cpu_tag>
            (local_38,local_58);
  return;
}

Assistant:

void matrix_assign(
	matrix_expression<M, Device>& m, 
	matrix_expression<E, Device> const& e,
	column_major, EOrientation,TagE tagE, TagM tagM
) {
	typedef typename M::orientation::transposed_orientation::orientation TMOrientation;
	typedef typename E::orientation::transposed_orientation::orientation TEOrientation;
	auto transM = trans(m);
	auto transE = trans(e);
	//dispatch to first version
	matrix_assign(transM, transE, TMOrientation(), TEOrientation(), tagE, tagM);
}